

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1a9663::RNGState::SeedEvents(RNGState *this,CSHA512 *hasher)

{
  long lVar1;
  CSHA256 *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  uchar events_hash [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->m_events_mutex,"m_events_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
             ,0x1ce,false);
  this_00 = &this->m_events_hasher;
  CSHA256::Finalize(this_00,events_hash);
  CSHA512::Write(hasher,events_hash,0x20);
  CSHA256::Reset(this_00);
  CSHA256::Write(this_00,events_hash,0x20);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_events_mutex)
    {
        // We use only SHA256 for the events hashing to get the ASM speedups we have for SHA256,
        // since we want it to be fast as network peers may be able to trigger it repeatedly.
        LOCK(m_events_mutex);

        unsigned char events_hash[32];
        m_events_hasher.Finalize(events_hash);
        hasher.Write(events_hash, 32);

        // Re-initialize the hasher with the finalized state to use later.
        m_events_hasher.Reset();
        m_events_hasher.Write(events_hash, 32);
    }